

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall StateIf::execute(StateIf *this,EvalState *state)

{
  string *psVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  
  psVar1 = &this->cmp;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
    iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    if (iVar2 == iVar3) goto LAB_0010b1eb;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 == 0) {
      iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
      iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      if (iVar3 < iVar2) goto LAB_0010b1eb;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar2 != 0) {
        return;
      }
      iVar2 = (*this->exp1->_vptr_Expression[2])(this->exp1,state);
      iVar3 = (*this->exp2->_vptr_Expression[2])(this->exp2,state);
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      if (iVar2 < iVar3) {
LAB_0010b1eb:
        iVar2 = this->Goto_lineNumber;
        *(undefined4 *)puVar4 = 1;
        *(int *)((long)puVar4 + 4) = iVar2;
        goto LAB_0010b22e;
      }
    }
  }
  *puVar4 = 2;
LAB_0010b22e:
  __cxa_throw(puVar4,&ControlClass::typeinfo,0);
}

Assistant:

void StateIf::execute(EvalState &state) {
    if (cmp == "=") {
        if (exp1->eval(state) == exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == ">") {
        if (exp1->eval(state) > exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    } else if (cmp == "<") {
        if (exp1->eval(state) < exp2->eval(state))
            throw ControlClass(1, Goto_lineNumber);
        else throw ControlClass(2);
    }
}